

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O0

void Assimp::ExportSceneFBX
               (char *pFile,IOSystem *pIOSystem,aiScene *pScene,ExportProperties *pProperties)

{
  undefined1 local_d0 [8];
  FBXExporter exporter;
  ExportProperties *pProperties_local;
  aiScene *pScene_local;
  IOSystem *pIOSystem_local;
  char *pFile_local;
  
  exporter.last_uid = (int64_t)pProperties;
  FBXExporter::FBXExporter((FBXExporter *)local_d0,pScene,pProperties);
  FBXExporter::ExportBinary((FBXExporter *)local_d0,pFile,pIOSystem);
  FBXExporter::~FBXExporter((FBXExporter *)local_d0);
  return;
}

Assistant:

void ExportSceneFBX (
        const char* pFile,
        IOSystem* pIOSystem,
        const aiScene* pScene,
        const ExportProperties* pProperties
    ){
        // initialize the exporter
        FBXExporter exporter(pScene, pProperties);

        // perform binary export
        exporter.ExportBinary(pFile, pIOSystem);
    }